

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassDeserializeBinary
          (Generator *this,GeneratorOptions *options,Printer *printer,Descriptor *desc)

{
  int iVar1;
  Descriptor *pDVar2;
  Printer *pPVar3;
  bool bVar4;
  int iVar5;
  FieldDescriptor *pFVar6;
  GeneratorOptions *options_00;
  GeneratorOptions *descriptor;
  Descriptor *in_R8;
  string local_98;
  string local_78;
  int local_58;
  int i;
  string local_48;
  GeneratorOptions *local_28;
  Descriptor *desc_local;
  Printer *printer_local;
  GeneratorOptions *options_local;
  Generator *this_local;
  
  local_28 = (GeneratorOptions *)desc;
  desc_local = (Descriptor *)printer;
  printer_local = (Printer *)options;
  options_local = (GeneratorOptions *)this;
  (anonymous_namespace)::GetMessagePath_abi_cxx11_
            (&local_48,(_anonymous_namespace_ *)options,(GeneratorOptions *)desc,desc);
  io::Printer::Print(printer,
                     "/**\n * Deserializes binary data (in protobuf wire format).\n * @param {jspb.ByteSource} bytes The bytes to deserialize.\n * @return {!$class$}\n */\n$class$.deserializeBinary = function(bytes) {\n  var reader = new jspb.BinaryReader(bytes);\n  var msg = new $class$;\n  return $class$.deserializeBinaryFromReader(msg, reader);\n};\n\n\n/**\n * Deserializes binary data (in protobuf wire format) from the\n * given reader into the given message object.\n * @param {!$class$} msg The message object to deserialize into.\n * @param {!jspb.BinaryReader} reader The BinaryReader to use.\n * @return {!$class$}\n */\n$class$.deserializeBinaryFromReader = function(msg, reader) {\n  while (reader.nextField()) {\n    if (reader.isEndGroup()) {\n      break;\n    }\n    var field = reader.getFieldNumber();\n    switch (field) {\n"
                     ,"class",&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  local_58 = 0;
  while( true ) {
    iVar1 = local_58;
    iVar5 = Descriptor::field_count((Descriptor *)local_28);
    if (iVar5 <= iVar1) break;
    pFVar6 = Descriptor::field((Descriptor *)local_28,local_58);
    bVar4 = anon_unknown_0::IgnoreField(pFVar6);
    pPVar3 = printer_local;
    pDVar2 = desc_local;
    if (!bVar4) {
      pFVar6 = Descriptor::field((Descriptor *)local_28,local_58);
      GenerateClassDeserializeBinaryField(this,(GeneratorOptions *)pPVar3,(Printer *)pDVar2,pFVar6);
    }
    local_58 = local_58 + 1;
  }
  io::Printer::Print((Printer *)desc_local,"    default:\n");
  bVar4 = anon_unknown_0::IsExtendable((Descriptor *)local_28);
  pPVar3 = printer_local;
  pDVar2 = desc_local;
  if (bVar4) {
    options_00 = (GeneratorOptions *)Descriptor::file((Descriptor *)local_28);
    descriptor = local_28;
    (anonymous_namespace)::JSExtensionsObjectName_abi_cxx11_
              (&local_78,(_anonymous_namespace_ *)pPVar3,options_00,(FileDescriptor *)local_28,in_R8
              );
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              (&local_98,(_anonymous_namespace_ *)printer_local,local_28,(Descriptor *)descriptor);
    io::Printer::Print((Printer *)pDVar2,
                       "      jspb.Message.readBinaryExtension(msg, reader, $extobj$Binary,\n        $class$.prototype.getExtension,\n        $class$.prototype.setExtension);\n      break;\n"
                       ,"extobj",&local_78,"class",&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_78);
  }
  else {
    io::Printer::Print((Printer *)desc_local,"      reader.skipField();\n      break;\n");
  }
  io::Printer::Print((Printer *)desc_local,"    }\n  }\n  return msg;\n};\n\n\n");
  return;
}

Assistant:

void Generator::GenerateClassDeserializeBinary(const GeneratorOptions& options,
                                               io::Printer* printer,
                                               const Descriptor* desc) const {
  // TODO(cfallin): Handle lazy decoding when requested by field option and/or
  // by default for 'bytes' fields and packed repeated fields.

  printer->Print(
      "/**\n"
      " * Deserializes binary data (in protobuf wire format).\n"
      " * @param {jspb.ByteSource} bytes The bytes to deserialize.\n"
      " * @return {!$class$}\n"
      " */\n"
      "$class$.deserializeBinary = function(bytes) {\n"
      "  var reader = new jspb.BinaryReader(bytes);\n"
      "  var msg = new $class$;\n"
      "  return $class$.deserializeBinaryFromReader(msg, reader);\n"
      "};\n"
      "\n"
      "\n"
      "/**\n"
      " * Deserializes binary data (in protobuf wire format) from the\n"
      " * given reader into the given message object.\n"
      " * @param {!$class$} msg The message object to deserialize into.\n"
      " * @param {!jspb.BinaryReader} reader The BinaryReader to use.\n"
      " * @return {!$class$}\n"
      " */\n"
      "$class$.deserializeBinaryFromReader = function(msg, reader) {\n"
      "  while (reader.nextField()) {\n"
      "    if (reader.isEndGroup()) {\n"
      "      break;\n"
      "    }\n"
      "    var field = reader.getFieldNumber();\n"
      "    switch (field) {\n",
      "class", GetMessagePath(options, desc));

  for (int i = 0; i < desc->field_count(); i++) {
    if (!IgnoreField(desc->field(i))) {
      GenerateClassDeserializeBinaryField(options, printer, desc->field(i));
    }
  }

  printer->Print(
      "    default:\n");
  if (IsExtendable(desc)) {
    printer->Print(
        "      jspb.Message.readBinaryExtension(msg, reader, $extobj$Binary,\n"
        "        $class$.prototype.getExtension,\n"
        "        $class$.prototype.setExtension);\n"
        "      break;\n",
        "extobj", JSExtensionsObjectName(options, desc->file(), desc),
        "class", GetMessagePath(options, desc));
  } else {
    printer->Print(
        "      reader.skipField();\n"
        "      break;\n");
  }

  printer->Print(
      "    }\n"
      "  }\n"
      "  return msg;\n"
      "};\n"
      "\n"
      "\n");
}